

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall tst_RoleMaskProxyModel::testRemoveRows_data(tst_RoleMaskProxyModel *this)

{
  QAbstractItemModel *pQVar1;
  QTestData *pQVar2;
  int iVar3;
  QAbstractItemModel *baseModel;
  QModelIndex local_98;
  QAbstractItemModel *local_80;
  quintptr local_78;
  QAbstractItemModel *pQStack_70;
  QModelIndex local_68;
  int local_4c [7];
  
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumnInternal(2,"removeIndex");
  QTest::addColumnInternal(0x2a,"parentIndex");
  pQVar2 = (QTestData *)QTest::newRow("List Remove Begin");
  local_80 = createListModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_80);
  local_98.r = 0;
  pQVar2 = ::operator<<(pQVar2,&local_98.r);
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  ::operator<<(pQVar2,&local_68);
  pQVar2 = (QTestData *)QTest::newRow("Table Remove Begin");
  local_80 = createTableModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_80);
  local_98.r = 0;
  pQVar2 = ::operator<<(pQVar2,&local_98.r);
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  ::operator<<(pQVar2,&local_68);
  pQVar2 = (QTestData *)QTest::newRow("Tree Remove Begin");
  local_80 = createTreeModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_80);
  local_98.r = 0;
  pQVar2 = ::operator<<(pQVar2,&local_98.r);
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  ::operator<<(pQVar2,&local_68);
  baseModel = createListModel(&this->super_QObject);
  pQVar2 = (QTestData *)QTest::newRow("List Remove End");
  pQVar2 = ::operator<<(pQVar2,&baseModel);
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  local_98.r = (**(code **)(*(long *)baseModel + 0x78))(baseModel,&local_68);
  local_98.r = local_98.r + -1;
  pQVar2 = ::operator<<(pQVar2,&local_98.r);
  local_80 = (QAbstractItemModel *)0xffffffffffffffff;
  local_78 = 0;
  pQStack_70 = (QAbstractItemModel *)0x0;
  ::operator<<(pQVar2,(QModelIndex *)&local_80);
  baseModel = createTableModel(&this->super_QObject);
  if (baseModel != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Table Remove End");
    pQVar2 = ::operator<<(pQVar2,&baseModel);
    local_68.r = -1;
    local_68.c = -1;
    local_68.i = 0;
    local_68.m = (QAbstractItemModel *)0x0;
    local_98.r = (**(code **)(*(long *)baseModel + 0x78))();
    local_98.r = local_98.r + -1;
    pQVar2 = ::operator<<(pQVar2,&local_98.r);
    local_80 = (QAbstractItemModel *)0xffffffffffffffff;
    local_78 = 0;
    pQStack_70 = (QAbstractItemModel *)0x0;
    ::operator<<(pQVar2,(QModelIndex *)&local_80);
  }
  baseModel = createTreeModel(&this->super_QObject);
  if (baseModel != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Tree Remove End");
    pQVar2 = ::operator<<(pQVar2,&baseModel);
    local_68.r = -1;
    local_68.c = -1;
    local_68.i = 0;
    local_68.m = (QAbstractItemModel *)0x0;
    local_98.r = (**(code **)(*(long *)baseModel + 0x78))();
    local_98.r = local_98.r + -1;
    pQVar2 = ::operator<<(pQVar2,&local_98.r);
    local_80 = (QAbstractItemModel *)0xffffffffffffffff;
    local_78 = 0;
    pQStack_70 = (QAbstractItemModel *)0x0;
    ::operator<<(pQVar2,(QModelIndex *)&local_80);
  }
  pQVar2 = (QTestData *)QTest::newRow("List Remove Middle");
  local_80 = createListModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_80);
  iVar3 = 2;
  local_98.r = iVar3;
  pQVar2 = ::operator<<(pQVar2,&local_98.r);
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  ::operator<<(pQVar2,&local_68);
  pQVar2 = (QTestData *)QTest::newRow("Table Remove Middle");
  local_80 = createTableModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_80);
  local_98.r = iVar3;
  pQVar2 = ::operator<<(pQVar2,&local_98.r);
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  ::operator<<(pQVar2,&local_68);
  pQVar2 = (QTestData *)QTest::newRow("Tree Remove Middle");
  local_80 = createTreeModel(&this->super_QObject);
  pQVar2 = ::operator<<(pQVar2,&local_80);
  local_98.r = iVar3;
  pQVar2 = ::operator<<(pQVar2,&local_98.r);
  local_68.r = -1;
  local_68.c = -1;
  local_68.i = 0;
  local_68.m = (QAbstractItemModel *)0x0;
  ::operator<<(pQVar2,&local_68);
  baseModel = createTreeModel(&this->super_QObject);
  if (baseModel != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Tree Remove Begin Child");
    pQVar2 = ::operator<<(pQVar2,&baseModel);
    local_98.r = 0;
    pQVar2 = ::operator<<(pQVar2,&local_98.r);
    local_80 = (QAbstractItemModel *)0xffffffffffffffff;
    local_78 = 0;
    pQStack_70 = (QAbstractItemModel *)0x0;
    (**(code **)(*(long *)baseModel + 0x60))(&local_68,baseModel,0,0);
    ::operator<<(pQVar2,&local_68);
  }
  baseModel = createTreeModel(&this->super_QObject);
  if (baseModel != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Tree Remove Middle Child");
    pQVar2 = ::operator<<(pQVar2,&baseModel);
    local_98.r = 2;
    pQVar2 = ::operator<<(pQVar2,&local_98.r);
    local_80 = (QAbstractItemModel *)0xffffffffffffffff;
    local_78 = 0;
    pQStack_70 = (QAbstractItemModel *)0x0;
    (**(code **)(*(long *)baseModel + 0x60))(&local_68,baseModel,0,0);
    ::operator<<(pQVar2,&local_68);
  }
  baseModel = createTreeModel(&this->super_QObject);
  if (baseModel != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Tree Remove End Child");
    pQVar2 = ::operator<<(pQVar2,&baseModel);
    pQVar1 = baseModel;
    local_80 = (QAbstractItemModel *)0xffffffffffffffff;
    local_78 = 0;
    pQStack_70 = (QAbstractItemModel *)0x0;
    (**(code **)(*(long *)baseModel + 0x60))(&local_68,baseModel,0,0);
    local_4c[0] = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_68);
    local_4c[0] = local_4c[0] + -1;
    pQVar2 = ::operator<<(pQVar2,local_4c);
    local_4c[1] = -1;
    local_4c[2] = -1;
    local_4c[3] = 0;
    local_4c[4] = 0;
    local_4c[5] = 0;
    local_4c[6] = 0;
    (**(code **)(*(long *)baseModel + 0x60))(&local_98,baseModel,0,0);
    ::operator<<(pQVar2,&local_98);
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testRemoveRows_data()
{
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<int>("removeIndex");
    QTest::addColumn<QModelIndex>("parentIndex");
    QTest::newRow("List Remove Begin") << createListModel(this) << 0 << QModelIndex();
    QTest::newRow("Table Remove Begin") << createTableModel(this) << 0 << QModelIndex();
    QTest::newRow("Tree Remove Begin") << createTreeModel(this) << 0 << QModelIndex();
    QAbstractItemModel *baseModel = createListModel(this);
    QTest::newRow("List Remove End") << baseModel << baseModel->rowCount() - 1 << QModelIndex();
    baseModel = createTableModel(this);
    if (baseModel)
        QTest::newRow("Table Remove End") << baseModel << baseModel->rowCount() - 1 << QModelIndex();
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove End") << baseModel << baseModel->rowCount() - 1 << QModelIndex();
    QTest::newRow("List Remove Middle") << createListModel(this) << 2 << QModelIndex();
    QTest::newRow("Table Remove Middle") << createTableModel(this) << 2 << QModelIndex();
    QTest::newRow("Tree Remove Middle") << createTreeModel(this) << 2 << QModelIndex();

    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove Begin Child") << baseModel << 0 << baseModel->index(0, 0);
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove Middle Child") << baseModel << 2 << baseModel->index(0, 0);
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove End Child") << baseModel << baseModel->rowCount(baseModel->index(0, 0)) - 1 << baseModel->index(0, 0);
}